

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCreate.c
# Opt level: O0

void Map_ManCreateNodeDelays(Map_Man_t *p,int LogFan)

{
  float fVar1;
  Map_Node_t *pMVar2;
  float *pfVar3;
  double dVar4;
  int local_24;
  int k;
  Map_Node_t *pNode;
  int LogFan_local;
  Map_Man_t *p_local;
  
  if (p->pNodeDelays != (float *)0x0) {
    __assert_fail("p->pNodeDelays == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCreate.c"
                  ,0x122,"void Map_ManCreateNodeDelays(Map_Man_t *, int)");
  }
  pfVar3 = (float *)calloc((long)p->vMapObjs->nSize,4);
  p->pNodeDelays = pfVar3;
  for (local_24 = 0; local_24 < p->vMapObjs->nSize; local_24 = local_24 + 1) {
    pMVar2 = p->vMapObjs->pArray[local_24];
    if (pMVar2->nRefs != 0) {
      fVar1 = (p->pSuperLib->tDelayInv).Worst;
      dVar4 = log((double)pMVar2->nRefs);
      p->pNodeDelays[local_24] = (float)((double)LogFan * 0.014426 * (double)fVar1 * dVar4);
    }
  }
  return;
}

Assistant:

void Map_ManCreateNodeDelays( Map_Man_t * p, int LogFan )
{
    Map_Node_t * pNode;
    int k;
    assert( p->pNodeDelays == NULL );
    p->pNodeDelays = ABC_CALLOC( float, p->vMapObjs->nSize );
    for ( k = 0; k < p->vMapObjs->nSize; k++ )
    {
        pNode = p->vMapObjs->pArray[k];
        if ( pNode->nRefs == 0 )
            continue;
        p->pNodeDelays[k] = 0.014426 * LogFan * p->pSuperLib->tDelayInv.Worst * log( (double)pNode->nRefs ); // 1.4426 = 1/ln(2)
//        printf( "%d = %d (%.2f)  ", k, pNode->nRefs, p->pNodeDelays[k] );
    }
//    printf( "\n" );
}